

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

Vector3f pbrt::SampleTrowbridgeReitzVisibleArea(Vector3f *w,Float alpha_x,Float alpha_y,Point2f *u)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  Vector3f VVar20;
  undefined1 local_a8 [16];
  float local_98;
  float local_68;
  undefined1 extraout_var [60];
  
  fVar7 = alpha_y * (w->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar19 = alpha_x * (w->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar14 = (w->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),ZEXT416((uint)fVar19),
                           ZEXT416((uint)fVar19));
  auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)fVar14),ZEXT416((uint)fVar14));
  auVar2 = vsqrtss_avx(auVar2,auVar2);
  fVar9 = auVar2._0_4_;
  fVar19 = fVar19 / fVar9;
  auVar15 = ZEXT416((uint)fVar19);
  auVar2 = vinsertps_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar14),0x10);
  auVar4._4_4_ = fVar9;
  auVar4._0_4_ = fVar9;
  auVar4._8_4_ = fVar9;
  auVar4._12_4_ = fVar9;
  auVar2 = vdivps_avx(auVar2,auVar4);
  auVar1._8_4_ = 0x80000000;
  auVar1._0_8_ = 0x8000000080000000;
  auVar1._12_4_ = 0x80000000;
  auVar4 = vxorps_avx512vl(auVar2,auVar1);
  auVar1 = vmovshdup_avx(auVar2);
  fVar14 = auVar1._0_4_;
  if (0.99999 <= fVar14) {
    local_a8 = SUB6416(ZEXT464(0x3f800000),0);
    auVar10 = ZEXT816(0);
  }
  else {
    auVar5 = vfmadd213ss_fma(ZEXT816(0),auVar1,auVar4);
    auVar1 = vinsertps_avx(auVar2,ZEXT416((uint)(fVar14 * 0.0)),0x10);
    auVar10 = vfmadd231ps_fma(auVar1,auVar2,_DAT_006015f0);
    auVar1 = vinsertps_avx(auVar5,ZEXT416((uint)(fVar19 - fVar14 * 0.0)),0x10);
    auVar6 = vfmsub213ss_fma(auVar2,ZEXT816(0) << 0x20,ZEXT416((uint)(fVar19 * 0.0)));
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * 0.0)),auVar15,ZEXT416(0x80000000));
    auVar11._0_4_ = auVar1._0_4_ + auVar10._0_4_;
    auVar11._4_4_ = auVar1._4_4_ + auVar10._4_4_;
    auVar11._8_4_ = auVar1._8_4_ + auVar10._8_4_;
    auVar11._12_4_ = auVar1._12_4_ + auVar10._12_4_;
    auVar16._0_4_ = auVar11._0_4_ * auVar11._0_4_;
    auVar16._4_4_ = auVar11._4_4_ * auVar11._4_4_;
    auVar16._8_4_ = auVar11._8_4_ * auVar11._8_4_;
    auVar16._12_4_ = auVar11._12_4_ * auVar11._12_4_;
    auVar1 = vmovshdup_avx(auVar16);
    fVar7 = auVar6._0_4_ + auVar5._0_4_;
    auVar1 = vfmadd231ss_fma(auVar1,auVar11,auVar11);
    auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
    auVar1 = vsqrtss_avx(auVar1,auVar1);
    fVar9 = auVar1._0_4_;
    auVar5._4_4_ = fVar9;
    auVar5._0_4_ = fVar9;
    auVar5._8_4_ = fVar9;
    auVar5._12_4_ = fVar9;
    auVar10._0_4_ = fVar7 / fVar9;
    auVar10._4_12_ = SUB6012((undefined1  [60])0x0,0);
    local_a8 = vdivps_avx(auVar11,auVar5);
  }
  fVar7 = (u->super_Tuple2<pbrt::Point2,_float>).x;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    auVar1 = vsqrtss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
    fVar7 = auVar1._0_4_;
  }
  fVar9 = (u->super_Tuple2<pbrt::Point2,_float>).y * 6.2831855;
  fVar8 = cosf(fVar9);
  fVar8 = fVar8 * fVar7;
  fVar9 = sinf(fVar9);
  auVar1 = vfnmadd213ss_fma(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8),ZEXT416(0x3f800000));
  if (auVar1._0_4_ < 0.0) {
    auVar13._0_4_ = sqrtf(auVar1._0_4_);
    auVar13._4_60_ = extraout_var;
    auVar5 = auVar13._0_16_;
  }
  else {
    auVar5 = vsqrtss_avx(auVar1,auVar1);
  }
  if (SampleTrowbridgeReitzVisibleArea(pbrt::Vector3<float>const&,float,float,pbrt::Point2<float>const&)
      ::reg == '\0') {
    iVar3 = __cxa_guard_acquire(&SampleTrowbridgeReitzVisibleArea(pbrt::Vector3<float>const&,float,float,pbrt::Point2<float>const&)
                                 ::reg);
    if (iVar3 != 0) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &SampleTrowbridgeReitzVisibleArea(pbrt::Vector3<float>const&,float,float,pbrt::Point2<float>const&)
                  ::reg,SampleTrowbridgeReitzVisibleArea(pbrt::Vector3<float>const&,float,float,pbrt::Point2<float>const&)
                        ::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                 (PixelAccumFunc)0x0);
      __cxa_guard_release(&SampleTrowbridgeReitzVisibleArea(pbrt::Vector3<float>const&,float,float,pbrt::Point2<float>const&)
                           ::reg);
    }
  }
  local_68 = auVar2._0_4_;
  auVar6 = vmovshdup_avx(local_a8);
  auVar11 = ZEXT416((uint)(local_a8._0_4_ * local_68));
  auVar6 = vfmsub132ss_fma(auVar6,auVar11,ZEXT416((uint)fVar19));
  auVar4 = vfmadd213ss_fma(auVar4,local_a8,auVar11);
  fVar19 = (fVar14 + 1.0) * 0.5;
  auVar5 = vfmadd213ss_fma(auVar5,ZEXT416((uint)(1.0 - fVar19)),
                           ZEXT416((uint)(fVar19 * fVar9 * fVar7)));
  local_98 = auVar10._0_4_;
  fVar19 = auVar5._0_4_;
  auVar1 = vfnmadd231ss_fma(auVar1,auVar5,auVar5);
  auVar1 = vmaxss_avx(auVar1,ZEXT416(0));
  *(long *)(in_FS_OFFSET + -0x720) = *(long *)(in_FS_OFFSET + -0x720) + 1;
  auVar1 = vsqrtss_avx(auVar1,auVar1);
  fVar7 = auVar1._0_4_;
  fVar14 = fVar8 * local_98 + (auVar6._0_4_ + auVar4._0_4_) * fVar19 + fVar14 * fVar7;
  if ((fVar14 == 0.0) && (!NAN(fVar14))) {
    *(long *)(in_FS_OFFSET + -0x728) = *(long *)(in_FS_OFFSET + -0x728) + 1;
  }
  auVar4 = vmaxss_avx(ZEXT416((uint)fVar14),ZEXT416(0x358637bd));
  auVar5 = vpermi2ps_avx512vl(_DAT_00601600,auVar2,auVar15);
  auVar6 = vpermi2ps_avx512vl(_DAT_00601610,auVar2,auVar15);
  auVar15 = vshufps_avx(local_a8,local_a8,0xe1);
  auVar1 = vinsertps_avx(auVar15,auVar10,0x10);
  auVar17._4_12_ = auVar15._4_12_;
  auVar17._0_4_ = local_98;
  auVar18._0_4_ = auVar5._0_4_ * auVar1._0_4_;
  auVar18._4_4_ = auVar5._4_4_ * auVar1._4_4_;
  auVar18._8_4_ = auVar5._8_4_ * auVar1._8_4_;
  auVar18._12_4_ = auVar5._12_4_ * auVar1._12_4_;
  auVar15 = vfmsub213ps_fma(auVar17,auVar2,auVar18);
  auVar1 = vfnmadd213ps_fma(auVar5,auVar1,auVar18);
  auVar2._4_4_ = in_XMM0_Db;
  auVar2._0_4_ = alpha_x;
  auVar2._8_4_ = in_XMM0_Dc;
  auVar2._12_4_ = in_XMM0_Dd;
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)alpha_y),0x10);
  auVar12._0_4_ =
       (local_a8._0_4_ * fVar8 + (auVar15._0_4_ + auVar1._0_4_) * fVar19 + auVar6._0_4_ * fVar7) *
       auVar2._0_4_;
  auVar12._4_4_ =
       (local_a8._4_4_ * fVar8 + (auVar15._4_4_ + auVar1._4_4_) * fVar19 + auVar6._4_4_ * fVar7) *
       auVar2._4_4_;
  auVar12._8_4_ =
       (local_a8._8_4_ * fVar8 + (auVar15._8_4_ + auVar1._8_4_) * fVar19 + auVar6._8_4_ * fVar7) *
       auVar2._8_4_;
  auVar12._12_4_ =
       (local_a8._12_4_ * fVar8 + (auVar15._12_4_ + auVar1._12_4_) * fVar19 + auVar6._12_4_ * fVar7)
       * auVar2._12_4_;
  auVar15._0_4_ = auVar12._0_4_ * auVar12._0_4_;
  auVar15._4_4_ = auVar12._4_4_ * auVar12._4_4_;
  auVar15._8_4_ = auVar12._8_4_ * auVar12._8_4_;
  auVar15._12_4_ = auVar12._12_4_ * auVar12._12_4_;
  auVar2 = vmovshdup_avx(auVar15);
  auVar2 = vfmadd231ss_fma(auVar2,auVar12,auVar12);
  auVar2 = vfmadd231ss_fma(auVar2,auVar4,auVar4);
  auVar2 = vsqrtss_avx(auVar2,auVar2);
  fVar14 = auVar2._0_4_;
  auVar6._4_4_ = fVar14;
  auVar6._0_4_ = fVar14;
  auVar6._8_4_ = fVar14;
  auVar6._12_4_ = fVar14;
  VVar20.super_Tuple3<pbrt::Vector3,_float>.z = auVar4._0_4_ / fVar14;
  auVar2 = vdivps_avx(auVar12,auVar6);
  VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar2._0_8_;
  return (Vector3f)VVar20.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

PBRT_CPU_GPU
inline Vector3f SampleTrowbridgeReitzVisibleArea(const Vector3f &w, Float alpha_x,
                                                 Float alpha_y, const Point2f &u) {
    // Section 3.2: transforming the view direction to the hemisphere
    // configuration
    Vector3f wh = Normalize(Vector3f(alpha_x * w.x, alpha_y * w.y, w.z));

    // Section 4.1: orthonormal basis. Can't use CoordinateSystem() since
    // T1 has to be in the tangent plane w.r.t. (0,0,1).
    Vector3f T1 =
        (wh.z < 0.99999f) ? Normalize(Cross(Vector3f(0, 0, 1), wh)) : Vector3f(1, 0, 0);
    Vector3f T2 = Cross(wh, T1);

    // Section 4.2: parameterization of the projected area
    Float r = std::sqrt(u[0]);
    Float phi = 2 * Pi * u[1];
    Float t1 = r * std::cos(phi), t2 = r * std::sin(phi);
    Float s = 0.5f * (1 + wh.z);
    t2 = (1 - s) * std::sqrt(1 - t1 * t1) + s * t2;

    // Section 4.3: reprojection onto hemisphere
    Vector3f nh =
        t1 * T1 + t2 * T2 + std::sqrt(std::max<Float>(0, 1 - t1 * t1 - t2 * t2)) * wh;

    // Section 3.4: transforming the normal back to the ellipsoid configuration
    CHECK_RARE(1e-6, nh.z == 0);
    return Normalize(
        Vector3f(alpha_x * nh.x, alpha_y * nh.y, std::max<Float>(1e-6f, nh.z)));
}